

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

void LowererMD::LegalizeOpnds<false>
               (Instr *instr,LegalForms dstForms,LegalForms src1Forms,LegalForms src2Forms)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  uVar6 = (ulong)src1Forms;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x769,"(instr)","instr");
    if (!bVar3) goto LAB_00666aaf;
    *puVar5 = 0;
  }
  if (((dstForms & LF_Optional) == L_None) &&
     ((instr->m_dst != (Opnd *)0x0) == (dstForms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76a,"(dstForms & LF_Optional || !instr->GetDst() == !dstForms)",
                       "dstForms & LF_Optional || !instr->GetDst() == !dstForms");
    if (!bVar3) goto LAB_00666aaf;
    *puVar5 = 0;
  }
  if (((src1Forms & LF_Optional) == L_None) &&
     ((instr->m_src1 != (Opnd *)0x0) == (src1Forms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76b,"(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms)",
                       "src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms");
    if (!bVar3) goto LAB_00666aaf;
    *puVar5 = 0;
  }
  if (((src2Forms & LF_Optional) == L_None) &&
     ((instr->m_src2 != (Opnd *)0x0) == (src2Forms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76c,"(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms)",
                       "src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms");
    if (!bVar3) goto LAB_00666aaf;
    *puVar5 = 0;
  }
  if (src2Forms != L_None && src1Forms == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76d,"(src1Forms || !src2Forms)","src1Forms || !src2Forms");
    if (!bVar3) {
LAB_00666aaf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if ((dstForms != L_None) && (instr->m_dst != (Opnd *)0x0)) {
    LegalizeDst<false>(instr,dstForms & L_FormMask | dstForms >> 1 & L_Imm32);
  }
  if (src1Forms == L_None) {
    return;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    return;
  }
  bVar2 = 1;
  if (((instr->m_dst != (Opnd *)0x0) &&
      (OVar4 = IR::Opnd::GetKind(instr->m_dst), OVar4 < OpndKindRegBV)) &&
     ((0x1480U >> (OVar4 & 0x1f) & 1) != 0)) {
    if ((src1Forms & L_Mem) != L_None) {
      bVar3 = EncoderMD::IsOPEQ(instr);
      uVar6 = (ulong)(src1Forms & ~L_Mem);
      if (bVar3) {
        uVar6 = (ulong)src1Forms;
      }
    }
    bVar2 = 0;
  }
  LegalizeSrc<false>(instr,instr->m_src1,
                     (LegalForms)uVar6 & L_FormMask | (LegalForms)(uVar6 >> 1) & L_Imm32);
  OVar4 = IR::Opnd::GetKind(instr->m_src1);
  if ((OVar4 < OpndKindRegBV) && ((0x1480U >> (OVar4 & 0x1f) & 1) != 0)) {
    if ((src2Forms & L_Mem) == L_None) goto LAB_00666a62;
  }
  else if ((bool)((src2Forms & L_Mem) == L_None | bVar2)) goto LAB_00666a62;
  src2Forms = src2Forms ^ L_Mem;
LAB_00666a62:
  if ((src2Forms != L_None) && (instr->m_src2 != (Opnd *)0x0)) {
    LegalizeSrc<false>(instr,instr->m_src2,src2Forms & L_FormMask | src2Forms >> 1 & L_Imm32);
    return;
  }
  return;
}

Assistant:

void LowererMD::LegalizeOpnds(IR::Instr *const instr, const LegalForms dstForms, LegalForms src1Forms, LegalForms src2Forms)
{
    Assert(instr);
    Assert(dstForms & LF_Optional || !instr->GetDst() == !dstForms);
    Assert(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms);
    Assert(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms);
    Assert(src1Forms || !src2Forms);

    const auto NormalizeForms = [](LegalForms forms) -> LegalForms
    {
    #ifdef _M_X64
        if(forms & L_Ptr)
        {
            forms |= L_Imm32;
        }
    #else
        if(forms & (L_Imm32 | L_Ptr))
        {
            forms |= L_Imm32 | L_Ptr;
        }
    #endif
        // Remove Legal Flags
        forms &= L_FormMask;
        return forms;
    };

    if(dstForms && instr->GetDst())
    {
        LegalizeDst<verify>(instr, NormalizeForms(dstForms));
    }
    if(!src1Forms || !instr->GetSrc1())
    {
        return;
    }
    bool hasMemOpnd = instr->GetDst() && instr->GetDst()->IsMemoryOpnd();

    // Allow src1 to be a mem opnd if dst & src1 must be the same
    if (hasMemOpnd && src1Forms & L_Mem && !EncoderMD::IsOPEQ(instr))
    {
        src1Forms ^= L_Mem;
    }
    LegalizeSrc<verify>(instr, instr->GetSrc1(), NormalizeForms(src1Forms));

    hasMemOpnd |= instr->GetSrc1()->IsMemoryOpnd();
    // If dst or src1 is a mem opnd, mem2 cannot be a mem opnd
    if(hasMemOpnd && src2Forms & L_Mem)
    {
        src2Forms ^= L_Mem;
    }
    if(src2Forms && instr->GetSrc2())
    {
        LegalizeSrc<verify>(instr, instr->GetSrc2(), NormalizeForms(src2Forms));
    }
}